

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O3

bool vera::loadPLY(string *_filename,Mesh *_mesh)

{
  pointer pvVar1;
  vec<2,_float,_(glm::qualifier)0> vVar2;
  Mesh *this;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  istream *piVar8;
  long lVar9;
  undefined8 extraout_RAX;
  long *plVar10;
  size_type *psVar11;
  bool bVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  vec<4,_float,_(glm::qualifier)0> vVar18;
  int colorCompsFound;
  int normalsCoordsFound;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vec3 n;
  float a;
  vec3 v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  float b;
  float g;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  string error;
  string line;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  string name;
  stringstream sline;
  fstream is;
  int local_558;
  int local_554;
  uint local_550;
  int local_54c;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_548;
  string *local_528;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_520;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_51c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_518;
  undefined4 uStack_514;
  undefined1 local_510 [16];
  long local_500;
  undefined4 local_4f4;
  ios_base *local_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4c8;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  undefined4 local_490;
  undefined4 local_48c;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_488;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  local_468;
  char *local_448;
  char *local_440;
  char local_438 [16];
  char *local_428;
  long local_420;
  char local_418 [16];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_408;
  Mesh *local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [128];
  ios_base aiStack_348 [264];
  long local_240 [66];
  
  std::fstream::fstream(local_240,(_filename->_M_dataplus)._M_p,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    local_428 = local_418;
    local_420 = 0;
    local_418[0] = '\0';
    local_448 = local_438;
    local_440 = (char *)0x0;
    local_438[0] = '\0';
    local_558 = 0;
    local_554 = 0;
    local_3e8 = local_3d8;
    local_3e0 = 0;
    local_3d8[0] = 0;
    local_468.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_468.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_548.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_548.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_548.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_488.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_488.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_488.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cVar3 = std::ios::widen((char)local_240 + (char)*(undefined8 *)(local_240[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_240,(string *)&local_428,cVar3);
    iVar4 = std::__cxx11::string::compare((char *)&local_428);
    if (iVar4 == 0) {
      cVar3 = std::ios::widen((char)(istream *)local_240 +
                              (char)*(undefined8 *)(local_240[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_240,(string *)&local_428,cVar3);
      iVar4 = std::__cxx11::string::compare((char *)&local_428);
      if (iVar4 != 0) {
        iVar4 = 2;
        std::__cxx11::string::_M_replace((ulong)&local_448,0,local_440,0x30e7b0);
        goto LAB_002aee21;
      }
      local_4f0 = aiStack_348;
      local_4a0 = 0;
      iVar6 = -1;
      iVar15 = -1;
      iVar4 = 3;
      iVar13 = -1;
      local_54c = 0;
      local_498 = 0;
      local_4a8 = 0;
      local_550 = 0;
      bVar14 = 0;
      local_528 = _filename;
      local_3f0 = _mesh;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) + (char)local_240);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_240,(string *)&local_428,cVar3);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e7db,0);
        if (lVar9 == 0) goto LAB_002af9d3;
        if (((bVar14 & 0xfd) == 0) &&
           (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e7e3,0), lVar9 == 0)) {
          iVar15 = 0;
          if (0 < iVar13) {
            iVar15 = iVar13;
          }
          std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_428);
          iVar6 = toInt((string *)local_3c8);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::resize(&local_548,(long)iVar6);
          if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
            operator_delete((void *)local_3c8._0_8_);
          }
          iVar15 = iVar15 + 1;
          iVar6 = iVar15;
          goto LAB_002af843;
        }
        if (bVar14 < 2) {
          lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e7f2,0);
          if (lVar9 == 0) {
            iVar13 = 0;
            if (0 < iVar15) {
              iVar13 = iVar15;
            }
            std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_428);
            iVar5 = toInt((string *)local_3c8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&local_4c8,(long)(iVar5 * 3));
            if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
              operator_delete((void *)local_3c8._0_8_);
            }
            iVar13 = iVar13 + 1;
            bVar14 = 2;
          }
          else {
            if (bVar14 != 1) goto LAB_002af403;
            lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e7ff,0);
            if (((lVar9 == 0) ||
                (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e810,0), lVar9 == 0)) ||
               (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e821,0), lVar9 == 0)) {
              local_4a0 = (ulong)((int)local_4a0 + 1);
LAB_002af843:
              bVar14 = 1;
            }
            else {
              lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e832,0);
              if (((lVar9 == 0) ||
                  (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e844,0), lVar9 == 0))
                 || (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e856,0), lVar9 == 0))
              {
                local_554 = local_554 + 1;
                bVar14 = 1;
                if (local_554 == 3) {
                  std::
                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ::resize(&local_488,
                           ((long)local_548.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_548.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555);
                }
              }
              else {
                lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e868,0);
                if (((lVar9 == 0) ||
                    (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e879,0), lVar9 == 0))
                   || ((lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e88a,0),
                       lVar9 == 0 ||
                       (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e89b,0),
                       lVar9 == 0)))) {
                  local_558 = local_558 + 1;
                  std::
                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ::resize(&local_468,
                           ((long)local_548.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_548.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555);
                  bVar14 = 1;
                  local_550 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                else {
                  lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e8ac,0);
                  if ((((lVar9 != 0) &&
                       (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e8bf,0),
                       lVar9 != 0)) &&
                      (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e8d4,0), lVar9 != 0
                      )) && (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e8e8,0),
                            lVar9 != 0)) {
                    lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e8fd,0);
                    if ((lVar9 == 0) ||
                       (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e90e,0),
                       lVar9 == 0)) {
                      std::
                      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ::resize(&local_408,
                               ((long)local_548.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_548.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                               -0x5555555555555555);
                    }
                    else {
                      lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e91f,0);
                      if ((lVar9 != 0) &&
                         (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e938,0),
                         lVar9 != 0)) goto LAB_002af403;
                      std::
                      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ::resize(&local_408,
                               ((long)local_548.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_548.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                               -0x5555555555555555);
                    }
                    local_54c = local_54c + 1;
                    goto LAB_002af843;
                  }
                  local_558 = local_558 + 1;
                  std::
                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ::resize(&local_468,
                           ((long)local_548.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_548.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555);
                  bVar14 = 1;
                  local_550 = 0;
                }
              }
            }
          }
        }
        else {
          if (((bVar14 == 2) &&
              (lVar9 = std::__cxx11::string::find((char *)&local_428,0x30e951,0), lVar9 != 0)) &&
             (iVar5 = std::__cxx11::string::compare((char *)&local_428), iVar5 != 0)) {
            std::__cxx11::string::operator=((string *)&local_448,"wrong face definition");
            _filename = local_528;
            goto LAB_002aee21;
          }
LAB_002af403:
          iVar5 = std::__cxx11::string::compare((char *)&local_428);
          if (iVar5 == 0) {
            if ((local_468.
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 local_468.
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) || (0xfffffffd < local_558 - 5U)) {
              if ((local_488.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish ==
                   local_488.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) || (local_554 == 3)) {
                if (local_548.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_548.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"ERROR glMesh, load(): mesh loaded from \"",0x28)
                  ;
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(local_528->_M_dataplus)._M_p,
                                      local_528->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"\" has no vertices",0x11);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                  std::ostream::put((char)poVar7);
                  std::ostream::flush();
                }
                bVar16 = iVar15 == -1;
                iVar15 = iVar6;
                if (bVar16) {
                  iVar15 = 9999;
                }
                if (iVar13 == -1) {
                  iVar13 = 9999;
                }
                bVar14 = (iVar13 <= iVar15) * '\x02' + 3;
                iVar6 = iVar15;
                goto LAB_002af9d3;
              }
              toString<int>((string *)local_4e8,&local_554);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_520,
                             "data has normal coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_4e8);
              _filename = local_528;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
            }
            else {
              toString<int>((string *)local_4e8,&local_558);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_520,
                             "data has color coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_4e8);
              _filename = local_528;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
            }
            psVar11 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar11) {
              local_3c8._16_8_ = *psVar11;
              local_3c8._24_8_ = plVar10[3];
              local_3c8._0_8_ = local_3c8 + 0x10;
            }
            else {
              local_3c8._16_8_ = *psVar11;
              local_3c8._0_8_ = (size_type *)*plVar10;
            }
            local_3c8._8_8_ = plVar10[1];
            *plVar10 = (long)psVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_448,(string *)local_3c8);
            if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
              operator_delete((void *)local_3c8._0_8_);
            }
            if ((undefined1 *)CONCAT44(aStack_51c,local_520) != local_510) {
              operator_delete((undefined1 *)CONCAT44(aStack_51c,local_520));
            }
            if ((undefined1 *)CONCAT44(local_4e8._4_4_,local_4e8._0_4_) != local_4d8) {
              operator_delete((undefined1 *)CONCAT44(local_4e8._4_4_,local_4e8._0_4_));
            }
            goto LAB_002aee21;
          }
          if (bVar14 == 5) {
            if (local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar14 = 5;
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
              std::__cxx11::stringbuf::str((string *)(local_3c8 + 0x18));
              std::istream::operator>>((stringstream *)local_3c8,(int *)&local_520);
              local_500 = CONCAT44(local_500._4_4_,local_520);
              if (local_520 == (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3)
              {
                std::istream::operator>>(local_3c8,(int *)local_4e8);
                lVar9 = (long)((int)local_4a8 * 3);
                local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9] = local_4e8._0_4_;
                std::istream::operator>>(local_3c8,(int *)local_4e8);
                local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9 + 1] = local_4e8._0_4_;
                std::istream::operator>>(local_3c8,(int *)local_4e8);
                local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9 + 2] = local_4e8._0_4_;
                local_4a8 = (ulong)((int)local_4a8 + 1);
                bVar14 = (iVar13 <= iVar15 ||
                         (ulong)((long)local_4c8.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4c8.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 !=
                         local_4a8) * '\x02' + 3;
              }
              else {
                bVar14 = 5;
                std::__cxx11::string::_M_replace((ulong)&local_448,0,local_440,0x30ea6b);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
              std::ios_base::~ios_base(local_4f0);
              _filename = local_528;
              if ((int)local_500 != 3) goto LAB_002aee21;
            }
          }
          else if (bVar14 == 3) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
            std::__cxx11::stringbuf::str((string *)(local_3c8 + 0x18));
            std::istream::_M_extract<float>((float *)local_3c8);
            std::istream::_M_extract<float>((float *)local_3c8);
            if (2 < (int)local_4a0) {
              std::istream::_M_extract<float>((float *)local_3c8);
            }
            lVar9 = (long)(int)local_498;
            local_548.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9].field_2 =
                 (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_4e8._8_4_;
            local_548.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_4e8._0_4_;
            local_548.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9].field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_4e8._4_4_;
            local_500 = lVar9;
            if (0 < local_554) {
              std::istream::_M_extract<float>((float *)local_3c8);
              std::istream::_M_extract<float>((float *)local_3c8);
              std::istream::_M_extract<float>((float *)local_3c8);
              local_488.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar9].field_2 = aStack_518;
              local_488.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar9].field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_520;
              local_488.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar9].field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aStack_51c;
            }
            if (0 < local_558) {
              if ((local_550 & 1) == 0) {
                local_4f4 = 0x437f0000;
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                if (3 < local_558) {
                  std::istream::_M_extract<float>((float *)local_3c8);
                }
                auVar17._4_4_ = local_48c;
                auVar17._0_4_ = local_520;
                auVar17._12_4_ = local_4f4;
                auVar17._8_4_ = local_490;
                vVar18 = (vec<4,_float,_(glm::qualifier)0>)divps(auVar17,_DAT_002e4ef0);
                local_468.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_500] = vVar18;
              }
              else {
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                if (3 < local_558) {
                  std::istream::_M_extract<float>((float *)local_3c8);
                }
                pvVar1 = local_468.
                         super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_500;
                pvVar1->field_0 =
                     (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_520;
                pvVar1->field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)aStack_51c;
                pvVar1->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)aStack_518;
                pvVar1->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_514;
              }
            }
            if (0 < local_54c) {
              std::istream::_M_extract<float>((float *)local_3c8);
              std::istream::_M_extract<float>((float *)local_3c8);
              vVar2.field_1 = aStack_51c;
              vVar2.field_0 = local_520;
              local_408.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_500] = vVar2;
            }
            local_498 = (ulong)((int)local_498 + 1);
            bVar14 = (iVar15 < iVar13 &&
                     ((long)local_548.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_548.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
                     local_498 == 0) * '\x02' + 3;
            std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
            std::ios_base::~ios_base(local_4f0);
          }
        }
LAB_002af9d3:
        iVar4 = iVar4 + 1;
      }
      std::fstream::close();
      this = local_3f0;
      _filename = local_528;
      Mesh::addColors(local_3f0,&local_468);
      Mesh::addVertices(this,&local_548);
      Mesh::addTexCoords(this,&local_408);
      if (local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        this->m_drawMode = POINTS;
      }
      else {
        Mesh::addIndices(this,&local_4c8);
      }
      if (local_488.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_488.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        Mesh::computeNormals(this);
      }
      else {
        Mesh::addNormals(this,&local_488);
      }
      Mesh::computeTangents(this);
      bVar16 = false;
    }
    else {
      iVar4 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_448,0,local_440,0x30e781);
LAB_002aee21:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR glMesh, load(): ",0x16);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_448,(long)local_440);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR glMesh, load(): \"",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_428,local_420);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      bVar16 = true;
      std::ostream::flush();
    }
    if (local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_408.
        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.
                      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_488.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_548.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_548.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_468.
        super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.
                      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3e8 != local_3d8) {
      operator_delete(local_3e8);
    }
    if (local_448 != local_438) {
      operator_delete(local_448);
    }
    if (local_428 != local_418) {
      operator_delete(local_428);
    }
    bVar12 = true;
    if (!bVar16) goto LAB_002af026;
  }
  std::fstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ERROR glMesh, can not load  ",0x1c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(_filename->_M_dataplus)._M_p,
                      _filename->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  bVar12 = false;
LAB_002af026:
  std::fstream::~fstream(local_240);
  return bVar12;
}

Assistant:

bool loadPLY( const std::string& _filename, Mesh& _mesh ) {
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {
        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        _mesh.addColors(colors);
        _mesh.addVertices(vertices);
        _mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 )
            _mesh.addIndices( indices );
        else 
            _mesh.setDrawMode( POINTS );
        
        if ( normals.size() > 0 )
            _mesh.addNormals( normals );
        else
            _mesh.computeNormals();

        _mesh.computeTangents();
        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}